

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

InstanceSymbol * __thiscall
slang::BumpAllocator::
emplace<slang::ast::InstanceSymbol,slang::ast::Compilation&,std::basic_string_view<char,std::char_traits<char>>const&,slang::SourceLocation&,slang::ast::DefinitionSymbol_const&,slang::ast::ParameterBuilder&,slang::ast::InstanceFlags>
          (BumpAllocator *this,Compilation *args,
          basic_string_view<char,_std::char_traits<char>_> *args_1,SourceLocation *args_2,
          DefinitionSymbol *args_3,ParameterBuilder *args_4,InstanceFlags *args_5)

{
  string_view name;
  Compilation *compilation;
  ParameterBuilder *in_RCX;
  SourceLocation *in_RDX;
  DefinitionSymbol *in_R9;
  InstanceFlags *in_stack_00000008;
  size_t in_stack_ffffffffffffff88;
  size_t in_stack_ffffffffffffff90;
  BumpAllocator *in_stack_ffffffffffffff98;
  undefined7 in_stack_ffffffffffffffb0;
  bitmask<slang::ast::InstanceFlags> in_stack_ffffffffffffffb7;
  bitmask<slang::ast::InstanceFlags> flags;
  SourceLocation loc;
  SourceLocation SVar1;
  DefinitionSymbol *pDVar2;
  
  compilation = (Compilation *)
                allocate(in_stack_ffffffffffffff98,in_stack_ffffffffffffff90,
                         in_stack_ffffffffffffff88);
  loc = *in_RDX;
  SVar1 = in_RDX[1];
  flags.m_bits = (underlying_type)((ulong)in_RCX->scope >> 0x38);
  pDVar2 = in_R9;
  bitmask<slang::ast::InstanceFlags>::bitmask
            ((bitmask<slang::ast::InstanceFlags> *)&stack0xffffffffffffffb7,*in_stack_00000008);
  name._M_str = (char *)pDVar2;
  name._M_len = (size_t)SVar1;
  ast::InstanceSymbol::InstanceSymbol
            ((InstanceSymbol *)CONCAT17(in_stack_ffffffffffffffb7.m_bits,in_stack_ffffffffffffffb0),
             compilation,name,loc,in_R9,in_RCX,flags);
  return (InstanceSymbol *)compilation;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }